

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSToUnicodeWithOffsets_63(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  long lVar1;
  UBool UVar2;
  byte bVar3;
  char cVar4;
  UChar UVar5;
  int32_t iVar6;
  uint uVar7;
  UChar32 UVar8;
  int iVar9;
  uint8_t *puVar10;
  UChar *pUVar11;
  uint uVar12;
  bool bVar13;
  bool local_92;
  bool local_91;
  uint8_t local_89;
  int32_t bytesFromThisBuffer;
  int8_t backOutDistance;
  uint uStack_84;
  int8_t i;
  UBool isDBCSOnly;
  uint8_t action;
  UChar c;
  int32_t entry;
  int32_t nextSourceIndex;
  int32_t sourceIndex;
  uint8_t *bytes;
  int8_t byteIndex;
  uint8_t state;
  uint32_t offset;
  uint16_t *unicodeCodeUnits;
  int32_t (*stateTable) [256];
  int32_t *offsets;
  UChar *targetLimit;
  UChar *target;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pArgs_local;
  
  source = (uint8_t *)pArgs->converter;
  cnv = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pArgs;
  if ('\0' < ((UConverter *)source)->preToULength) {
    ucnv_extContinueMatchToU_63((UConverter *)source,pArgs,-1,pErrorCode);
    UVar2 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
    if (UVar2 != '\0') {
      return;
    }
    if ((char)source[0x11a] < '\0') {
      return;
    }
  }
  if (*(char *)(*(long *)(source + 0x30) + 0x30) == '\x01') {
    if ((*(byte *)(*(long *)(source + 0x30) + 0xfd) & 1) == 0) {
      ucnv_MBCSSingleToBMPWithOffsets((UConverterToUnicodeArgs *)pErrorCode_local,(UErrorCode *)cnv)
      ;
    }
    else {
      ucnv_MBCSSingleToUnicodeWithOffsets
                ((UConverterToUnicodeArgs *)pErrorCode_local,(UErrorCode *)cnv);
    }
  }
  else {
    sourceLimit = *(uint8_t **)(pErrorCode_local + 4);
    target = *(UChar **)(pErrorCode_local + 6);
    targetLimit = *(UChar **)(pErrorCode_local + 8);
    offsets = *(int32_t **)(pErrorCode_local + 10);
    stateTable = *(int32_t (**) [256])(pErrorCode_local + 0xc);
    if ((*(uint *)(source + 0x38) & 0x10) == 0) {
      unicodeCodeUnits = *(uint16_t **)(*(long *)(source + 0x30) + 0x38);
    }
    else {
      unicodeCodeUnits = *(uint16_t **)(*(long *)(source + 0x30) + 0x40);
    }
    lVar1 = *(long *)(*(long *)(source + 0x30) + 0x48);
    bytes._4_4_ = *(uint *)(source + 0x48);
    bytes._2_1_ = source[0x40];
    puVar10 = source + 0x41;
    bytes._3_1_ = (byte)*(uint *)(source + 0x4c);
    if ((*(uint *)(source + 0x4c) & 0xff) == 0) {
      bytes._3_1_ = *(byte *)(*(long *)(source + 0x30) + 0x31);
    }
    iVar6 = -1;
    if (bytes._2_1_ == '\0') {
      iVar6 = 0;
    }
    _isDBCSOnly = 0;
LAB_0038ba1f:
    do {
      do {
        entry = iVar6;
        if (target <= sourceLimit) goto LAB_0038c536;
        if (offsets <= targetLimit) {
          *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
          goto LAB_0038c536;
        }
        if (bytes._2_1_ == '\0') {
          if (stateTable == (int32_t (*) [256])0x0) {
            do {
              uStack_84 = *(uint *)(unicodeCodeUnits +
                                   (ulong)bytes._3_1_ * 0x200 + (ulong)*sourceLimit * 2);
              bVar3 = (byte)(uStack_84 >> 0x18);
              if ((int)uStack_84 < 0) {
                if (-0x7ff00001 < (int)uStack_84) break;
                sourceLimit = sourceLimit + 1;
                *targetLimit = (UChar)uStack_84;
              }
              else {
                bytes._4_4_ = uStack_84 & 0xffffff;
                pUVar11 = (UChar *)(sourceLimit + 1);
                if (((target <= pUVar11) ||
                    (uStack_84 = *(uint *)(unicodeCodeUnits +
                                          (ulong)bVar3 * 0x200 + (ulong)(byte)*pUVar11 * 2),
                    -1 < (int)uStack_84)) ||
                   (((uStack_84 >> 0x14 & 0xf) != 4 ||
                    (UVar5 = *(UChar *)(lVar1 + (ulong)(bytes._4_4_ + (uStack_84 & 0xffff)) * 2),
                    0xfffd < (ushort)UVar5)))) {
                  *puVar10 = *sourceLimit;
                  bytes._2_1_ = '\x01';
                  bytes._3_1_ = bVar3;
                  sourceLimit = (uint8_t *)pUVar11;
                  break;
                }
                sourceLimit = sourceLimit + 2;
                *targetLimit = UVar5;
                bVar3 = (byte)(uStack_84 >> 0x18);
                bytes._4_4_ = 0;
              }
              targetLimit = targetLimit + 1;
              bytes._3_1_ = bVar3 & 0x7f;
              local_91 = sourceLimit < target && targetLimit < offsets;
            } while (local_91);
          }
          else {
            do {
              uStack_84 = *(uint *)(unicodeCodeUnits +
                                   (ulong)bytes._3_1_ * 0x200 + (ulong)*sourceLimit * 2);
              bVar3 = (byte)(uStack_84 >> 0x18);
              if ((int)uStack_84 < 0) {
                if (-0x7ff00001 < (int)uStack_84) break;
                sourceLimit = sourceLimit + 1;
                *targetLimit = (UChar)uStack_84;
                if (stateTable != (int32_t (*) [256])0x0) {
                  (*stateTable)[0] = entry;
                  _isDBCSOnly = _isDBCSOnly + 1;
                  entry = _isDBCSOnly;
                  stateTable = (int32_t (*) [256])(*stateTable + 1);
                }
              }
              else {
                bytes._4_4_ = uStack_84 & 0xffffff;
                pUVar11 = (UChar *)(sourceLimit + 1);
                if ((((target <= pUVar11) ||
                     (uStack_84 = *(uint *)(unicodeCodeUnits +
                                           (ulong)bVar3 * 0x200 + (ulong)(byte)*pUVar11 * 2),
                     -1 < (int)uStack_84)) || ((uStack_84 >> 0x14 & 0xf) != 4)) ||
                   (UVar5 = *(UChar *)(lVar1 + (ulong)(bytes._4_4_ + (uStack_84 & 0xffff)) * 2),
                   0xfffd < (ushort)UVar5)) {
                  _isDBCSOnly = _isDBCSOnly + 1;
                  *puVar10 = *sourceLimit;
                  bytes._2_1_ = '\x01';
                  bytes._3_1_ = bVar3;
                  sourceLimit = (uint8_t *)pUVar11;
                  break;
                }
                sourceLimit = sourceLimit + 2;
                *targetLimit = UVar5;
                if (stateTable != (int32_t (*) [256])0x0) {
                  (*stateTable)[0] = entry;
                  _isDBCSOnly = _isDBCSOnly + 2;
                  entry = _isDBCSOnly;
                  stateTable = (int32_t (*) [256])(*stateTable + 1);
                }
                bVar3 = (byte)(uStack_84 >> 0x18);
                bytes._4_4_ = 0;
              }
              targetLimit = targetLimit + 1;
              bytes._3_1_ = bVar3 & 0x7f;
              local_92 = sourceLimit < target && targetLimit < offsets;
            } while (local_92);
          }
          if (target <= sourceLimit) goto LAB_0038c536;
          if (offsets <= targetLimit) {
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
            goto LAB_0038c536;
          }
          puVar10[(char)bytes._2_1_] = *sourceLimit;
        }
        else {
          bVar3 = *sourceLimit;
          puVar10[(char)bytes._2_1_] = bVar3;
          uStack_84 = *(uint *)(unicodeCodeUnits + (ulong)bytes._3_1_ * 0x200 + (ulong)bVar3 * 2);
        }
        sourceLimit = sourceLimit + 1;
        bytes._2_1_ = bytes._2_1_ + '\x01';
        _isDBCSOnly = _isDBCSOnly + 1;
        bVar3 = (byte)(uStack_84 >> 0x18);
        if (-1 < (int)uStack_84) {
          bytes._4_4_ = (uStack_84 & 0xffffff) + bytes._4_4_;
          iVar6 = entry;
          bytes._3_1_ = bVar3;
          goto LAB_0038ba1f;
        }
        *(uint *)(source + 0x4c) = (uint)bytes._3_1_;
        bytes._3_1_ = bVar3 & 0x7f;
        bVar3 = (byte)(uStack_84 >> 0x14) & 0xf;
        if (bVar3 == 4) {
          uVar7 = (uStack_84 & 0xffff) + bytes._4_4_;
          UVar5 = *(UChar *)(lVar1 + (ulong)uVar7 * 2);
          if ((ushort)UVar5 < 0xfffe) {
            *targetLimit = UVar5;
            if (stateTable != (int32_t (*) [256])0x0) {
              (*stateTable)[0] = entry;
              stateTable = (int32_t (*) [256])(*stateTable + 1);
            }
            bytes._2_1_ = '\0';
            targetLimit = targetLimit + 1;
          }
          else if (UVar5 == L'\xfffe') {
            UVar8 = ucnv_MBCSGetFallback
                              ((UConverterMBCSTable *)(*(long *)(source + 0x30) + 0x30),uVar7);
            if (UVar8 != 0xfffe) {
              *targetLimit = (UChar)UVar8;
              if (stateTable != (int32_t (*) [256])0x0) {
                (*stateTable)[0] = entry;
                stateTable = (int32_t (*) [256])(*stateTable + 1);
              }
              bytes._2_1_ = '\0';
              targetLimit = targetLimit + 1;
            }
          }
          else {
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
          }
        }
        else if ((uStack_84 >> 0x14 & 0xf) == 0) {
          *targetLimit = (UChar)uStack_84;
          if (stateTable != (int32_t (*) [256])0x0) {
            (*stateTable)[0] = entry;
            stateTable = (int32_t (*) [256])(*stateTable + 1);
          }
          bytes._2_1_ = '\0';
          targetLimit = targetLimit + 1;
        }
        else if (bVar3 == 5) {
          uVar7 = (uStack_84 & 0xffff) + bytes._4_4_;
          uVar12 = uVar7 + 1;
          UVar5 = *(UChar *)(lVar1 + (ulong)uVar7 * 2);
          if ((ushort)UVar5 < 0xd800) {
            *targetLimit = UVar5;
            if (stateTable != (int32_t (*) [256])0x0) {
              (*stateTable)[0] = entry;
              stateTable = (int32_t (*) [256])(*stateTable + 1);
            }
            bytes._2_1_ = '\0';
            targetLimit = targetLimit + 1;
          }
          else if ((ushort)UVar5 < 0xe000) {
            pUVar11 = targetLimit + 1;
            *targetLimit = UVar5 & 0xdbff;
            if (stateTable != (int32_t (*) [256])0x0) {
              (*stateTable)[0] = entry;
              stateTable = (int32_t (*) [256])(*stateTable + 1);
            }
            bytes._2_1_ = '\0';
            if (offsets <= pUVar11) {
              *(undefined2 *)(source + 0x90) = *(undefined2 *)(lVar1 + (ulong)uVar12 * 2);
              source[0x5d] = '\x01';
              *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
              bytes._4_4_ = 0;
              targetLimit = pUVar11;
              goto LAB_0038c536;
            }
            targetLimit = targetLimit + 2;
            *pUVar11 = *(UChar *)(lVar1 + (ulong)uVar12 * 2);
            if (stateTable != (int32_t (*) [256])0x0) {
              (*stateTable)[0] = entry;
              stateTable = (int32_t (*) [256])(*stateTable + 1);
            }
          }
          else if ((UVar5 & 0xfffeU) == 0xe000) {
            *targetLimit = *(UChar *)(lVar1 + (ulong)uVar12 * 2);
            if (stateTable != (int32_t (*) [256])0x0) {
              (*stateTable)[0] = entry;
              stateTable = (int32_t (*) [256])(*stateTable + 1);
            }
            bytes._2_1_ = '\0';
            targetLimit = targetLimit + 1;
          }
          else if (UVar5 == L'\xffff') {
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
          }
        }
        else if ((bVar3 == 1) || (bVar3 == 3)) {
          pUVar11 = targetLimit + 1;
          *targetLimit = (ushort)((int)(uStack_84 & 0xfffff) >> 10) | 0xd800;
          if (stateTable != (int32_t (*) [256])0x0) {
            (*stateTable)[0] = entry;
            stateTable = (int32_t (*) [256])(*stateTable + 1);
          }
          bytes._2_1_ = '\0';
          UVar5 = (ushort)(uStack_84 & 0xfffff) & 0x3ff | 0xdc00;
          if (offsets <= pUVar11) {
            *(UChar *)(source + 0x90) = UVar5;
            source[0x5d] = '\x01';
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
            bytes._4_4_ = 0;
            targetLimit = pUVar11;
            goto LAB_0038c536;
          }
          targetLimit = targetLimit + 2;
          *pUVar11 = UVar5;
          if (stateTable != (int32_t (*) [256])0x0) {
            (*stateTable)[0] = entry;
            stateTable = (int32_t (*) [256])(*stateTable + 1);
          }
        }
        else if (bVar3 == 8) {
          if (*(char *)(*(long *)(source + 0x30) + 0x31) == '\0') {
            bytes._2_1_ = '\0';
          }
          else {
            bytes._3_1_ = (byte)*(undefined4 *)(source + 0x4c);
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
          }
        }
        else if (bVar3 == 2) {
          *targetLimit = (UChar)uStack_84;
          if (stateTable != (int32_t (*) [256])0x0) {
            (*stateTable)[0] = entry;
            stateTable = (int32_t (*) [256])(*stateTable + 1);
          }
          bytes._2_1_ = '\0';
          targetLimit = targetLimit + 1;
        }
        else if (bVar3 != 6) {
          if (bVar3 == 7) {
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
          }
          else {
            bytes._2_1_ = '\0';
          }
        }
        bytes._4_4_ = 0;
        iVar6 = _isDBCSOnly;
      } while (bytes._2_1_ == '\0');
      UVar2 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if (UVar2 != '\0') {
        if ('\x01' < (char)bytes._2_1_) {
          cVar4 = *(char *)(*(long *)(source + 0x30) + 0x31);
          local_89 = '\x01';
          while( true ) {
            bVar13 = false;
            if ((char)local_89 < (char)bytes._2_1_) {
              UVar2 = isSingleOrLead((int32_t (*) [256])unicodeCodeUnits,bytes._3_1_,cVar4 != '\0',
                                     puVar10[(char)local_89]);
              bVar13 = UVar2 == '\0';
            }
            if (!bVar13) break;
            local_89 = local_89 + '\x01';
          }
          if ((char)local_89 < (char)bytes._2_1_) {
            cVar4 = bytes._2_1_ - local_89;
            iVar9 = (int)sourceLimit - (int)*(undefined8 *)(pErrorCode_local + 4);
            bytes._2_1_ = local_89;
            if (iVar9 < cVar4) {
              source[0x11a] = (char)iVar9 - cVar4;
              memcpy(source + 0xfa,puVar10 + (int)(char)local_89,(long)-(int)(char)source[0x11a]);
              sourceLimit = *(uint8_t **)(pErrorCode_local + 4);
            }
            else {
              sourceLimit = sourceLimit + -(long)(int)cVar4;
            }
          }
        }
        break;
      }
      *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
      bytes._2_1_ = _extToU((UConverter *)source,*(UConverterSharedData **)(source + 0x30),
                            bytes._2_1_,&sourceLimit,(uint8_t *)target,&targetLimit,(UChar *)offsets
                            ,(int32_t **)&stateTable,entry,*(byte *)((long)pErrorCode_local + 2),
                            (UErrorCode *)cnv);
      _isDBCSOnly = ((int)sourceLimit - (int)*(undefined8 *)(pErrorCode_local + 4)) + _isDBCSOnly;
      UVar2 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      iVar6 = _isDBCSOnly;
    } while (UVar2 == '\0');
LAB_0038c536:
    *(uint *)(source + 0x48) = bytes._4_4_;
    *(uint *)(source + 0x4c) = (uint)bytes._3_1_;
    source[0x40] = bytes._2_1_;
    *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
    *(UChar **)(pErrorCode_local + 8) = targetLimit;
    *(int32_t (**) [256])(pErrorCode_local + 0xc) = stateTable;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_MBCSToUnicodeWithOffsets(UConverterToUnicodeArgs *pArgs,
                          UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit;
    UChar *target;
    const UChar *targetLimit;
    int32_t *offsets;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;
    int8_t byteIndex;
    uint8_t *bytes;

    int32_t sourceIndex, nextSourceIndex;

    int32_t entry;
    UChar c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /*
         * pass sourceIndex=-1 because we continue from an earlier buffer
         * in the future, this may change with continuous offsets
         */
        ucnv_extContinueMatchToU(cnv, pArgs, -1, pErrorCode);

        if(U_FAILURE(*pErrorCode) || cnv->preToULength<0) {
            return;
        }
    }

    if(cnv->sharedData->mbcs.countStates==1) {
        if(!(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
            ucnv_MBCSSingleToBMPWithOffsets(pArgs, pErrorCode);
        } else {
            ucnv_MBCSSingleToUnicodeWithOffsets(pArgs, pErrorCode);
        }
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    target=pArgs->target;
    targetLimit=pArgs->targetLimit;
    offsets=pArgs->offsets;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;
    byteIndex=cnv->toULength;
    bytes=cnv->toUBytes;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex=byteIndex==0 ? 0 : -1;
    nextSourceIndex=0;

    /* conversion loop */
    while(source<sourceLimit) {
        /*
         * This following test is to see if available input would overflow the output.
         * It does not catch output of more than one code unit that
         * overflows as a result of a surrogate pair or callback output
         * from the last source byte.
         * Therefore, those situations also test for overflows and will
         * then break the loop, too.
         */
        if(target>=targetLimit) {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }

        if(byteIndex==0) {
            /* optimized loop for 1/2-byte input and BMP output */
            if(offsets==NULL) {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            } else /* offsets!=NULL */ {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=(nextSourceIndex+=2);
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            ++nextSourceIndex;
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=++nextSourceIndex;
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            }

            /*
             * these tests and break statements could be put inside the loop
             * if C had "break outerLoop" like Java
             */
            if(source>=sourceLimit) {
                break;
            }
            if(target>=targetLimit) {
                /* target is full */
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                break;
            }

            ++nextSourceIndex;
            bytes[byteIndex++]=*source++;
        } else /* byteIndex>0 */ {
            ++nextSourceIndex;
            entry=stateTable[state][bytes[byteIndex++]=*source++];
        }

        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
            continue;
        }

        /* save the previous state for proper extension mapping with SI/SO-stateful converters */
        cnv->mode=state;

        /* set the next state early so that we can reuse the entry variable */
        state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_VALID_16) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset];
            if(c<0xfffe) {
                /* output BMP code point */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xfffe) {
                if(UCNV_TO_U_USE_FALLBACK(cnv) && (entry=(int32_t)ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                    /* output fallback BMP code point */
                    *target++=(UChar)entry;
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                    byteIndex=0;
                }
            } else {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_16) {
            /* output BMP code point */
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
        } else if(action==MBCS_STATE_VALID_16_PAIR) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset++];
            if(c<0xd800) {
                /* output BMP code point below 0xd800 */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                /* output roundtrip or fallback surrogate pair */
                *target++=(UChar)(c&0xdbff);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
                if(target<targetLimit) {
                    *target++=unicodeCodeUnits[offset];
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                } else {
                    /* target overflow */
                    cnv->UCharErrorBuffer[0]=unicodeCodeUnits[offset];
                    cnv->UCharErrorBufferLength=1;
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                    offset=0;
                    break;
                }
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                *target++=unicodeCodeUnits[offset];
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xffff) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                  (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
        ) {
            entry=MBCS_ENTRY_FINAL_VALUE(entry);
            /* output surrogate pair */
            *target++=(UChar)(0xd800|(UChar)(entry>>10));
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
            c=(UChar)(0xdc00|(UChar)(entry&0x3ff));
            if(target<targetLimit) {
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
            } else {
                /* target overflow */
                cnv->UCharErrorBuffer[0]=c;
                cnv->UCharErrorBufferLength=1;
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                offset=0;
                break;
            }
        } else if(action==MBCS_STATE_CHANGE_ONLY) {
            /*
             * This serves as a state change without any output.
             * It is useful for reading simple stateful encodings,
             * for example using just Shift-In/Shift-Out codes.
             * The 21 unused bits may later be used for more sophisticated
             * state transitions.
             */
            if(cnv->sharedData->mbcs.dbcsOnlyState==0) {
                byteIndex=0;
            } else {
                /* SI/SO are illegal for DBCS-only conversion */
                state=(uint8_t)(cnv->mode); /* restore the previous state */

                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            byteIndex=0;
        }

        /* end of action codes: prepare for a new character */
        offset=0;

        if(byteIndex==0) {
            sourceIndex=nextSourceIndex;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            if(byteIndex>1) {
                /*
                 * Ticket 5691: consistent illegal sequences:
                 * - We include at least the first byte in the illegal sequence.
                 * - If any of the non-initial bytes could be the start of a character,
                 *   we stop the illegal sequence before the first one of those.
                 */
                UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
                int8_t i;
                for(i=1;
                    i<byteIndex && !isSingleOrLead(stateTable, state, isDBCSOnly, bytes[i]);
                    ++i) {}
                if(i<byteIndex) {
                    /* Back out some bytes. */
                    int8_t backOutDistance=byteIndex-i;
                    int32_t bytesFromThisBuffer=(int32_t)(source-(const uint8_t *)pArgs->source);
                    byteIndex=i;  /* length of reported illegal byte sequence */
                    if(backOutDistance<=bytesFromThisBuffer) {
                        source-=backOutDistance;
                    } else {
                        /* Back out bytes from the previous buffer: Need to replay them. */
                        cnv->preToULength=(int8_t)(bytesFromThisBuffer-backOutDistance);
                        /* preToULength is negative! */
                        uprv_memcpy(cnv->preToU, bytes+i, -cnv->preToULength);
                        source=(const uint8_t *)pArgs->source;
                    }
                }
            }
            break;
        } else /* unassigned sequences indicated with byteIndex>0 */ {
            /* try an extension mapping */
            pArgs->source=(const char *)source;
            byteIndex=_extToU(cnv, cnv->sharedData,
                              byteIndex, &source, sourceLimit,
                              &target, targetLimit,
                              &offsets, sourceIndex,
                              pArgs->flush,
                              pErrorCode);
            sourceIndex=nextSourceIndex+=(int32_t)(source-(const uint8_t *)pArgs->source);

            if(U_FAILURE(*pErrorCode)) {
                /* not mappable or buffer overflow */
                break;
            }
        }
    }

    /* set the converter state back into UConverter */
    cnv->toUnicodeStatus=offset;
    cnv->mode=state;
    cnv->toULength=byteIndex;

    /* write back the updated pointers */
    pArgs->source=(const char *)source;
    pArgs->target=target;
    pArgs->offsets=offsets;
}